

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O3

void test_binary(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char extraout_var_00;
  long extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  undefined8 extraout_RAX_02;
  int extraout_var;
  long extraout_RAX_03;
  undefined8 extraout_RAX_04;
  undefined8 extraout_RAX_05;
  undefined8 extraout_RAX_06;
  undefined8 extraout_RAX_07;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar13;
  char *pcVar14;
  char *extraout_RAX_08;
  dirent *pdVar15;
  size_t sVar16;
  size_t sVar17;
  DIR *__dirp;
  FILE *__stream;
  long lVar18;
  char *pcVar19;
  uint extraout_EDX;
  char *__dest;
  int paths_index;
  ulong uVar20;
  char *pcVar21;
  DIR *__s;
  DIR *__name;
  char *pcVar22;
  DIR *paths;
  DIR *__filename;
  undefined1 *puVar23;
  char *pcVar24;
  char *pcVar25;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auStack_7688 [8];
  undefined1 auStack_7680 [504];
  ulong uStack_7488;
  DIR *pDStack_7480;
  dirent *pdStack_7478;
  DIR *pDStack_7470;
  DIR *pDStack_7468;
  stat sStack_7460;
  char acStack_73d0 [512];
  size_t sStack_71d0;
  dirent *pdStack_71c8;
  DIR *pDStack_71c0;
  char *pcStack_71b8;
  code *pcStack_71b0;
  char *pcStack_71a8;
  ulong uStack_71a0;
  char *pcStack_7198;
  DIR *pDStack_7190;
  code *pcStack_7188;
  undefined8 uStack_7150;
  undefined1 *puStack_7148;
  undefined1 *puStack_7140;
  undefined1 auStack_7130 [8];
  char *pcStack_7128;
  char *pcStack_7118;
  char *pcStack_7110;
  undefined8 uStack_7108;
  undefined8 uStack_70f0;
  DIR aDStack_7080 [25944];
  char *pcStack_b28;
  char *pcStack_b20;
  char *pcStack_b18;
  char *pcStack_b10;
  code *apcStack_b08 [2];
  undefined1 auStack_af8 [116];
  uint uStack_a84;
  char acStack_a80 [256];
  undefined8 uStack_980;
  char *pcStack_978;
  char *pcStack_970;
  char *pcStack_968;
  char *pcStack_960;
  char *pcStack_958;
  char *pcStack_950;
  undefined8 uStack_948;
  code *pcStack_940;
  char *pcStack_938;
  undefined8 uStack_930;
  char *pcStack_928;
  char *pcStack_920;
  char *pcStack_918;
  char *pcStack_910;
  code *pcStack_908;
  undefined8 uStack_900;
  undefined8 uStack_8f8;
  char *pcStack_8f0;
  char *pcStack_8e8;
  char *pcStack_8e0;
  undefined8 uStack_8d8;
  bson_t *pbStack_8d0;
  char *pcStack_8c8;
  code *pcStack_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  char *pcStack_8a0;
  char *pcStack_898;
  char *pcStack_890;
  char *pcStack_888;
  char *pcStack_880;
  code *pcStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined1 *puStack_858;
  char *pcStack_850;
  char *pcStack_848;
  code *pcStack_840;
  undefined8 uStack_838;
  ulong uStack_830;
  ulong uStack_828;
  undefined1 *puStack_820;
  char *pcStack_818;
  void *pvStack_810;
  code *pcStack_808;
  uint uStack_784;
  undefined1 auStack_780 [4];
  uint uStack_77c;
  ulong uStack_630;
  ulong uStack_628;
  undefined1 *puStack_620;
  char *pcStack_618;
  void *pvStack_610;
  code *apcStack_608 [16];
  uint uStack_584;
  undefined1 auStack_580 [4];
  uint uStack_57c;
  undefined8 uStack_438;
  ulong uStack_430;
  undefined1 *puStack_428;
  char *pcStack_420;
  undefined8 uStack_418;
  code *apcStack_410 [2];
  undefined8 uStack_400;
  code *pcStack_3f8;
  undefined8 uStack_3e8;
  code *pcStack_3e0;
  long lStack_3d8;
  undefined8 uStack_3d0;
  code *pcStack_3c8;
  undefined8 uStack_3c0;
  int iStack_3b8;
  int iStack_3b4;
  undefined8 uStack_3b0;
  char *pcStack_3a8;
  code *pcStack_3a0;
  int iStack_394;
  ulong uStack_390;
  code *pcStack_388;
  undefined8 uStack_380;
  uint uStack_30c;
  char *pcStack_308;
  undefined1 auStack_300 [4];
  uint uStack_2fc;
  undefined8 uStack_190;
  char *pcStack_160;
  undefined8 uStack_158;
  code *pcStack_150;
  char *pcStack_148;
  undefined8 uStack_140;
  code *pcStack_138;
  undefined8 uStack_130;
  undefined8 uStack_120;
  char *pcStack_118;
  undefined1 auStack_10c [12];
  undefined8 uStack_100;
  char *pcStack_f8;
  code *pcStack_f0;
  undefined8 uStack_e8;
  char *pcStack_d8;
  char *pcStack_d0;
  undefined8 uStack_c8;
  char *pcStack_c0;
  code *pcStack_b8;
  undefined8 uStack_a8;
  code *pcStack_a0;
  long lStack_98;
  undefined8 uStack_90;
  code *pcStack_88;
  char cStack_79;
  undefined8 uStack_78;
  code *pcStack_70;
  undefined8 uStack_68;
  undefined1 auStack_5c [12];
  undefined8 uStack_50;
  code *pcStack_48;
  undefined8 uStack_40;
  undefined1 *puStack_38;
  code *pcStack_30;
  uint32_t len;
  bson_subtype_t subtype;
  uint8_t *binary;
  
  pcStack_30 = (code *)0x13c843;
  uVar6 = bson_bcon_magic();
  pcStack_30 = (code *)0x0;
  puStack_38 = (undefined1 *)0x8;
  uStack_40 = 0x13c86f;
  uVar6 = bcon_new(0,"foo",uVar6,4,0,"deadbeef");
  pcStack_30 = (code *)0x13c87b;
  uVar7 = bson_bcone_magic();
  pcStack_30 = (code *)0x0;
  uStack_40 = 0x13c8a1;
  puStack_38 = (undefined1 *)&len;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,4,&subtype,&binary);
  if (cVar1 == '\0') {
    pcStack_30 = (code *)0x13c8e1;
    test_binary_cold_1();
LAB_0013c8e1:
    pcStack_30 = (code *)0x13c8e6;
    test_binary_cold_2();
LAB_0013c8e6:
    pcStack_30 = (code *)0x13c8eb;
    test_binary_cold_3();
  }
  else {
    if (subtype != BSON_SUBTYPE_BINARY) goto LAB_0013c8e1;
    if (len != 8) goto LAB_0013c8e6;
    if (*(long *)binary == 0x6665656264616564) {
      pcStack_30 = (code *)0x13c8d2;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_30 = test_undefined;
  test_binary_cold_4();
  pcStack_30 = (code *)0x1403a7;
  pcStack_48 = (code *)0x13c8f9;
  puStack_38 = (undefined1 *)uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_48 = (code *)0x13c917;
  uVar6 = bcon_new(0,"foo",uVar6,5,0);
  pcStack_48 = (code *)0x13c91f;
  uVar7 = bson_bcone_magic();
  pcStack_48 = (code *)0x13c937;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,5,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  pcStack_48 = test_oid;
  test_undefined_cold_1();
  pcStack_48 = (code *)0x1403a7;
  pcStack_70 = (code *)0x13c965;
  uStack_50 = uVar6;
  bson_oid_init(auStack_5c,0);
  pcStack_70 = (code *)0x13c96a;
  uVar6 = bson_bcon_magic();
  pcStack_70 = (code *)0x13c98b;
  uVar6 = bcon_new(0,"foo",uVar6,6,auStack_5c,0);
  pcStack_70 = (code *)0x13c993;
  uVar7 = bson_bcone_magic();
  pcStack_70 = (code *)0x13c9ae;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,6,&uStack_68,0);
  if (cVar1 == '\0') {
    pcStack_70 = (code *)0x13c9d9;
    test_oid_cold_1();
  }
  else {
    pcStack_70 = (code *)0x13c9c0;
    cVar1 = bson_oid_equal(auStack_5c,uStack_68);
    if (cVar1 != '\0') {
      pcStack_70 = (code *)0x13c9cc;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_70 = test_bool;
  test_oid_cold_2();
  pcStack_70 = (code *)0x1403a7;
  pcStack_88 = (code *)0x13c9e7;
  uStack_78 = uVar6;
  cStack_79 = extraout_var_00;
  uVar6 = bson_bcon_magic();
  pcStack_88 = (code *)0x13ca0b;
  uVar6 = bcon_new(0,"foo",uVar6,7,1,0);
  pcStack_88 = (code *)0x13ca13;
  uVar7 = bson_bcone_magic();
  pcStack_88 = (code *)0x13ca30;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,7,&cStack_79,0);
  if (cVar1 == '\0') {
    pcStack_88 = (code *)0x13ca50;
    test_bool_cold_1();
  }
  else if (cStack_79 != '\0') {
    pcStack_88 = (code *)0x13ca43;
    bson_destroy(uVar6);
    return;
  }
  pcStack_88 = test_date_time;
  test_bool_cold_2();
  pcStack_88 = (code *)0x1403a7;
  pcStack_a0 = (code *)0x13ca5e;
  lStack_98 = extraout_RAX;
  uStack_90 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_a0 = (code *)0x13ca82;
  uVar6 = bcon_new(0,"foo",uVar6,8,10000,0);
  pcStack_a0 = (code *)0x13ca8a;
  uVar7 = bson_bcone_magic();
  pcStack_a0 = (code *)0x13caa5;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,8,&lStack_98,0);
  if (cVar1 == '\0') {
    pcStack_a0 = (code *)0x13cac8;
    test_date_time_cold_1();
  }
  else if (lStack_98 == 10000) {
    pcStack_a0 = (code *)0x13cabb;
    bson_destroy(uVar6);
    return;
  }
  pcStack_a0 = test_null;
  test_date_time_cold_2();
  pcStack_a0 = (code *)0x1403a7;
  pcStack_b8 = (code *)0x13cad6;
  uStack_a8 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_b8 = (code *)0x13caf4;
  uVar6 = bcon_new(0,"foo",uVar6,9,0);
  pcStack_b8 = (code *)0x13cafc;
  uVar7 = bson_bcone_magic();
  pcStack_b8 = (code *)0x13cb14;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,9,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  pcStack_b8 = test_regex;
  test_null_cold_1();
  pcStack_b8 = (code *)0x0;
  pcStack_c0 = "foo";
  pcStack_f0 = (code *)0x13cb3a;
  uStack_c8 = uVar6;
  uVar6 = bson_bcon_magic();
  uStack_e8 = 0;
  pcStack_f0 = (code *)0x13cb6a;
  uVar6 = bcon_new(0,"foo",uVar6,10,"^foo|bar$","i");
  pcStack_f0 = (code *)0x13cb72;
  uVar7 = bson_bcone_magic();
  uStack_e8 = 0;
  pcStack_f0 = (code *)0x13cb95;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,10,&pcStack_d0,&pcStack_d8);
  if (cVar1 == '\0') {
    pcStack_f0 = (code *)0x13cbd5;
    test_regex_cold_1();
LAB_0013cbd5:
    pcStack_f0 = (code *)0x13cbda;
    test_regex_cold_2();
  }
  else {
    pcStack_f0 = (code *)0x13cbaa;
    iVar2 = strcmp(pcStack_d0,"^foo|bar$");
    if (iVar2 != 0) goto LAB_0013cbd5;
    if ((*pcStack_d8 == 'i') && (pcStack_d8[1] == '\0')) {
      pcStack_f0 = (code *)0x13cbc6;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_f0 = test_dbpointer;
  test_regex_cold_3();
  pcStack_f0 = (code *)0x0;
  pcStack_f8 = "foo";
  pcStack_138 = (code *)0x13cbfa;
  uStack_100 = uVar6;
  bson_oid_init(auStack_10c,0);
  pcStack_138 = (code *)0x13cbff;
  uVar6 = bson_bcon_magic();
  uStack_130 = 0;
  pcStack_138 = (code *)0x13cc28;
  uVar6 = bcon_new(0,"foo",uVar6,0xb,"collection",auStack_10c);
  pcStack_138 = (code *)0x13cc30;
  uVar7 = bson_bcone_magic();
  uStack_130 = 0;
  pcStack_138 = (code *)0x13cc53;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xb,&pcStack_118,&uStack_120);
  if (cVar1 == '\0') {
    pcStack_138 = (code *)0x13cc96;
    test_dbpointer_cold_1();
LAB_0013cc96:
    pcStack_138 = (code *)0x13cc9b;
    test_dbpointer_cold_2();
  }
  else {
    pcStack_138 = (code *)0x13cc68;
    iVar2 = strcmp(pcStack_118,"collection");
    if (iVar2 != 0) goto LAB_0013cc96;
    pcStack_138 = (code *)0x13cc7b;
    cVar1 = bson_oid_equal(uStack_120,auStack_10c);
    if (cVar1 != '\0') {
      pcStack_138 = (code *)0x13cc87;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_138 = test_code;
  test_dbpointer_cold_3();
  pcStack_138 = (code *)0x1403a7;
  pcStack_150 = (code *)0x13cca9;
  pcStack_148 = extraout_RAX_00;
  uStack_140 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_150 = (code *)0x13ccce;
  uVar6 = bcon_new(0,"foo",uVar6,0xc,"var a = {};",0);
  pcStack_150 = (code *)0x13ccd6;
  uVar7 = bson_bcone_magic();
  pcStack_150 = (code *)0x13ccf1;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xc,&pcStack_148,0);
  if (cVar1 == '\0') {
    pcStack_150 = (code *)0x13cd1e;
    test_code_cold_1();
  }
  else {
    pcStack_150 = (code *)0x13cd05;
    iVar2 = strcmp(pcStack_148,"var a = {};");
    if (iVar2 == 0) {
      pcStack_150 = (code *)0x13cd11;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_150 = test_symbol;
  test_code_cold_2();
  pcStack_150 = (code *)0x1403a7;
  pcStack_160 = extraout_RAX_01;
  uStack_158 = uVar6;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0xd,"symbol",0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xd,&pcStack_160,0);
  if (cVar1 == '\0') {
    test_symbol_cold_1();
  }
  else {
    iVar2 = strcmp(pcStack_160,"symbol");
    if (iVar2 == 0) {
      bson_destroy(uVar6);
      return;
    }
  }
  test_symbol_cold_2();
  pcStack_388 = (code *)0x13cdc3;
  uStack_190 = uVar6;
  pvVar8 = (void *)bson_bcon_magic();
  puVar23 = (undefined1 *)0x0;
  pcStack_388 = (code *)0x13cdea;
  uVar9 = bcon_new(0,"b",pvVar8,0xf,10,0);
  uStack_380 = 0;
  pcVar25 = "foo";
  pcStack_388 = (code *)0x13ce16;
  uVar10 = bcon_new(0,"foo",pvVar8,0xe,"var a = b;",uVar9);
  pcStack_388 = (code *)0x13ce1e;
  uVar6 = bson_bcone_magic();
  uStack_380 = 0;
  pcStack_388 = (code *)0x13ce44;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,0xe,&pcStack_308,auStack_300);
  if (cVar1 == '\0') {
    pcStack_388 = (code *)0x13cfdd;
    test_codewscope_cold_1();
LAB_0013cfdd:
    pcStack_388 = (code *)0x13cfe2;
    test_codewscope_cold_2();
  }
  else {
    pcStack_388 = (code *)0x13ce5d;
    iVar2 = strcmp(pcStack_308,"var a = b;");
    if (iVar2 != 0) goto LAB_0013cfdd;
    pcStack_388 = (code *)0x13ce75;
    pcVar25 = (char *)bson_get_data(auStack_300);
    pcStack_388 = (code *)0x13ce80;
    pvVar8 = (void *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_2fc) {
      pcStack_388 = (code *)0x13ce94;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_388 = (code *)0x13cea4;
      pvVar12 = (void *)bson_get_data(auStack_300);
      pcStack_388 = (code *)0x13ceb2;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_388 = (code *)0x13cec3;
        bson_destroy(auStack_300);
        pcStack_388 = (code *)0x13cecb;
        bson_destroy(uVar9);
        pcStack_388 = (code *)0x13ced3;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar23 = auStack_300;
    pcStack_388 = (code *)0x13cef4;
    uVar10 = bson_as_canonical_extended_json(puVar23);
    pcStack_388 = (code *)0x13cf01;
    uVar6 = bson_as_canonical_extended_json(uVar9);
    uVar3 = *(uint *)(uVar9 + 4);
    if (uStack_2fc != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (pcVar25[uVar20] != *(char *)((long)pvVar8 + uVar20)) goto LAB_0013cfd1;
        uVar20 = uVar20 + 1;
      } while (uStack_2fc != (uint)uVar20);
    }
    uVar4 = uStack_2fc;
    if (uStack_2fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_388 = (code *)0x13cf4d;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar10,uVar6);
      pcStack_388 = (code *)0x13cf65;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar10 = (ulong)uVar3;
      pcStack_388 = (code *)0x13cf80;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_30c = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013cfe7;
      uVar10 = (ulong)uStack_2fc;
      pcStack_388 = (code *)0x13cfaa;
      uVar20 = write(uVar3,pcVar25,uVar10);
      if (uVar20 != uVar10) goto LAB_0013cfec;
      uVar9 = (ulong)*(uint *)(uVar9 + 4);
      pcStack_388 = (code *)0x13cfc0;
      uVar20 = write(uVar4,pvVar8,uVar9);
      if (uVar20 != uVar9) goto LAB_0013cff1;
      uVar20 = (ulong)uVar4;
      pcStack_388 = (code *)0x13cfd1;
      test_codewscope_cold_5();
      uVar6 = extraout_RAX_02;
LAB_0013cfd1:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  pcStack_388 = (code *)0x13cfe7;
  test_codewscope_cold_7();
LAB_0013cfe7:
  pcStack_388 = (code *)0x13cfec;
  test_codewscope_cold_6();
LAB_0013cfec:
  pcStack_388 = (code *)0x13cff1;
  test_codewscope_cold_3();
LAB_0013cff1:
  pcStack_388 = test_int32;
  test_codewscope_cold_4();
  pcStack_3a0 = (code *)0x13cfff;
  uStack_390 = uVar9;
  pcStack_388 = (code *)pvVar8;
  iStack_394 = extraout_var;
  uVar6 = bson_bcon_magic();
  pcStack_3a0 = (code *)0x13d023;
  uVar6 = bcon_new(0,"foo",uVar6,0xf,10,0);
  pcStack_3a0 = (code *)0x13d02b;
  uVar7 = bson_bcone_magic();
  pcStack_3a0 = (code *)0x13d048;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xf,&iStack_394,0);
  if (cVar1 == '\0') {
    pcStack_3a0 = (code *)0x13d068;
    test_int32_cold_1();
  }
  else if (iStack_394 == 10) {
    pcStack_3a0 = (code *)0x13d05b;
    bson_destroy(uVar6);
    return;
  }
  pcStack_3a0 = test_timestamp;
  test_int32_cold_2();
  pcStack_3a8 = "foo";
  pcStack_3c8 = (code *)0x13d07b;
  uStack_3b0 = uVar6;
  pcStack_3a0 = (code *)pcVar25;
  uVar6 = bson_bcon_magic();
  pvVar8 = (void *)0x0;
  uStack_3c0 = 0;
  pcStack_3c8 = (code *)0x13d0a9;
  uVar6 = bcon_new(0,"foo",uVar6,0x10,100,1000);
  pcStack_3c8 = (code *)0x13d0b1;
  uVar7 = bson_bcone_magic();
  uStack_3c0 = 0;
  pcStack_3c8 = (code *)0x13d0d4;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x10,&iStack_3b4,&iStack_3b8);
  if (cVar1 == '\0') {
    pcStack_3c8 = (code *)0x13d100;
    test_timestamp_cold_1();
LAB_0013d100:
    pcStack_3c8 = (code *)0x13d105;
    test_timestamp_cold_2();
  }
  else {
    if (iStack_3b4 != 100) goto LAB_0013d100;
    if (iStack_3b8 == 1000) {
      pcStack_3c8 = (code *)0x13d0f1;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_3c8 = test_int64;
  test_timestamp_cold_3();
  pcStack_3c8 = (code *)0x1403a7;
  pcStack_3e0 = (code *)0x13d113;
  lStack_3d8 = extraout_RAX_03;
  uStack_3d0 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_3e0 = (code *)0x13d137;
  uVar6 = bcon_new(0,"foo",uVar6,0x11,10,0);
  pcStack_3e0 = (code *)0x13d13f;
  uVar7 = bson_bcone_magic();
  pcStack_3e0 = (code *)0x13d15a;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x11,&lStack_3d8,0);
  if (cVar1 == '\0') {
    pcStack_3e0 = (code *)0x13d17a;
    test_int64_cold_1();
  }
  else if (lStack_3d8 == 10) {
    pcStack_3e0 = (code *)0x13d16d;
    bson_destroy(uVar6);
    return;
  }
  pcStack_3e0 = test_maxkey;
  test_int64_cold_2();
  pcStack_3e0 = (code *)0x1403a7;
  pcStack_3f8 = (code *)0x13d188;
  uStack_3e8 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_3f8 = (code *)0x13d1a6;
  uVar6 = bcon_new(0,"foo",uVar6,0x13,0);
  pcStack_3f8 = (code *)0x13d1ae;
  uVar7 = bson_bcone_magic();
  pcStack_3f8 = (code *)0x13d1c6;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  pcStack_3f8 = test_minkey;
  test_maxkey_cold_1();
  pcStack_3f8 = (code *)0x1403a7;
  apcStack_410[0] = (code *)0x13d1e7;
  uStack_400 = uVar6;
  uVar6 = bson_bcon_magic();
  apcStack_410[0] = (code *)0x13d205;
  uVar6 = bcon_new(0,"foo",uVar6,0x14,0);
  apcStack_410[0] = (code *)0x13d20d;
  uVar7 = bson_bcone_magic();
  apcStack_410[0] = (code *)0x13d225;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  apcStack_410[0] = test_bson_document;
  test_minkey_cold_1();
  uStack_418 = 0;
  pcStack_420 = "foo";
  apcStack_608[0] = (code *)0x13d26e;
  uStack_438 = uVar6;
  uStack_430 = uVar10;
  puStack_428 = puVar23;
  apcStack_410[0] = (code *)&stack0xfffffffffffffe98;
  uVar9 = bcon_new(0,"bar","baz",0);
  apcStack_608[0] = (code *)0x13d276;
  uVar6 = bson_bcon_magic();
  pcVar25 = "foo";
  apcStack_608[0] = (code *)0x13d297;
  uVar10 = bcon_new(0,"foo",uVar6,2,uVar9,0);
  apcStack_608[0] = (code *)0x13d29f;
  uVar6 = bson_bcone_magic();
  apcStack_608[0] = (code *)0x13d2bf;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,2,auStack_580,0);
  if (cVar1 == '\0') {
    apcStack_608[0] = (code *)0x13d43f;
    test_bson_document_cold_1();
  }
  else {
    apcStack_608[0] = (code *)0x13d2d7;
    pvVar8 = (void *)bson_get_data(auStack_580);
    apcStack_608[0] = (code *)0x13d2e2;
    pcVar25 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_57c) {
      apcStack_608[0] = (code *)0x13d2f6;
      pvVar11 = (void *)bson_get_data(uVar9);
      apcStack_608[0] = (code *)0x13d306;
      pvVar12 = (void *)bson_get_data(auStack_580);
      apcStack_608[0] = (code *)0x13d314;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        apcStack_608[0] = (code *)0x13d325;
        bson_destroy(auStack_580);
        apcStack_608[0] = (code *)0x13d32d;
        bson_destroy(uVar9);
        apcStack_608[0] = (code *)0x13d335;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar23 = auStack_580;
    apcStack_608[0] = (code *)0x13d356;
    uVar10 = bson_as_canonical_extended_json(puVar23);
    apcStack_608[0] = (code *)0x13d363;
    uVar6 = bson_as_canonical_extended_json(uVar9);
    uVar3 = *(uint *)(uVar9 + 4);
    if (uStack_57c != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar8 + uVar20) != pcVar25[uVar20]) goto LAB_0013d433;
        uVar20 = uVar20 + 1;
      } while (uStack_57c != (uint)uVar20);
    }
    uVar4 = uStack_57c;
    if (uStack_57c < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_608[0] = (code *)0x13d3af;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar10,uVar6);
      apcStack_608[0] = (code *)0x13d3c7;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar10 = (ulong)uVar3;
      apcStack_608[0] = (code *)0x13d3e2;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_584 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d444;
      uVar10 = (ulong)uStack_57c;
      apcStack_608[0] = (code *)0x13d40c;
      uVar20 = write(uVar3,pvVar8,uVar10);
      if (uVar20 != uVar10) goto LAB_0013d449;
      uVar9 = (ulong)*(uint *)(uVar9 + 4);
      apcStack_608[0] = (code *)0x13d422;
      uVar20 = write(uVar4,pcVar25,uVar9);
      if (uVar20 != uVar9) goto LAB_0013d44e;
      uVar20 = (ulong)uVar4;
      apcStack_608[0] = (code *)0x13d433;
      test_bson_document_cold_4();
      uVar6 = extraout_RAX_04;
LAB_0013d433:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  apcStack_608[0] = (code *)0x13d444;
  test_bson_document_cold_6();
LAB_0013d444:
  apcStack_608[0] = (code *)0x13d449;
  test_bson_document_cold_5();
LAB_0013d449:
  apcStack_608[0] = (code *)0x13d44e;
  test_bson_document_cold_2();
LAB_0013d44e:
  apcStack_608[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_808 = (code *)0x13d484;
  uStack_630 = uVar9;
  uStack_628 = uVar10;
  puStack_620 = puVar23;
  pcStack_618 = pcVar25;
  pvStack_610 = pvVar8;
  apcStack_608[0] = (code *)apcStack_410;
  uVar9 = bcon_new(0,"0","baz",0);
  pcStack_808 = (code *)0x13d48c;
  uVar6 = bson_bcon_magic();
  pcVar25 = "foo";
  pcStack_808 = (code *)0x13d4ad;
  uVar10 = bcon_new(0,"foo",uVar6,3,uVar9,0);
  pcStack_808 = (code *)0x13d4b5;
  uVar6 = bson_bcone_magic();
  pcStack_808 = (code *)0x13d4d5;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,3,auStack_780,0);
  if (cVar1 == '\0') {
    pcStack_808 = (code *)0x13d655;
    test_bson_array_cold_1();
  }
  else {
    pcStack_808 = (code *)0x13d4ed;
    pvVar8 = (void *)bson_get_data(auStack_780);
    pcStack_808 = (code *)0x13d4f8;
    pcVar25 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_77c) {
      pcStack_808 = (code *)0x13d50c;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_808 = (code *)0x13d51c;
      pvVar12 = (void *)bson_get_data(auStack_780);
      pcStack_808 = (code *)0x13d52a;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_808 = (code *)0x13d53b;
        bson_destroy(auStack_780);
        pcStack_808 = (code *)0x13d543;
        bson_destroy(uVar9);
        pcStack_808 = (code *)0x13d54b;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar23 = auStack_780;
    pcStack_808 = (code *)0x13d56c;
    uVar10 = bson_as_canonical_extended_json(puVar23);
    pcStack_808 = (code *)0x13d579;
    uVar6 = bson_as_canonical_extended_json(uVar9);
    uVar3 = *(uint *)(uVar9 + 4);
    if (uStack_77c != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar8 + uVar20) != pcVar25[uVar20]) goto LAB_0013d649;
        uVar20 = uVar20 + 1;
      } while (uStack_77c != (uint)uVar20);
    }
    uVar4 = uStack_77c;
    if (uStack_77c < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_808 = (code *)0x13d5c5;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar10,uVar6);
      pcStack_808 = (code *)0x13d5dd;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar10 = (ulong)uVar3;
      pcStack_808 = (code *)0x13d5f8;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_784 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d65a;
      uVar10 = (ulong)uStack_77c;
      pcStack_808 = (code *)0x13d622;
      uVar20 = write(uVar3,pvVar8,uVar10);
      if (uVar20 != uVar10) goto LAB_0013d65f;
      uVar9 = (ulong)*(uint *)(uVar9 + 4);
      pcStack_808 = (code *)0x13d638;
      uVar20 = write(uVar4,pcVar25,uVar9);
      if (uVar20 != uVar9) goto LAB_0013d664;
      uVar20 = (ulong)uVar4;
      pcStack_808 = (code *)0x13d649;
      test_bson_array_cold_4();
      uVar6 = extraout_RAX_05;
LAB_0013d649:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  pcStack_808 = (code *)0x13d65a;
  test_bson_array_cold_6();
LAB_0013d65a:
  pcStack_808 = (code *)0x13d65f;
  test_bson_array_cold_5();
LAB_0013d65f:
  pcStack_808 = (code *)0x13d664;
  test_bson_array_cold_2();
LAB_0013d664:
  pcStack_808 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_840 = (code *)0x13d679;
  uStack_838 = extraout_RAX_06;
  uStack_830 = uVar9;
  uStack_828 = uVar10;
  puStack_820 = puVar23;
  pcStack_818 = pcVar25;
  pvStack_810 = pvVar8;
  pcStack_808 = (code *)apcStack_608;
  uStack_868 = bson_bcon_magic();
  pcStack_848 = (char *)0x0;
  pcStack_850 = "]";
  puStack_858 = (undefined1 *)0x2;
  uStack_860 = 0xf;
  uStack_870 = 0x13d6c1;
  uVar6 = bcon_new(0,"foo","[",uStack_868,0xf,1);
  pcStack_840 = (code *)0x13d6cd;
  uStack_868 = bson_bcone_magic();
  pcStack_848 = (char *)0x0;
  pcStack_850 = "]";
  uStack_860 = 0xf;
  uStack_870 = 0x13d6fc;
  puStack_858 = (undefined1 *)&uStack_838;
  cVar1 = bcon_extract(uVar6,"foo","[",uStack_868,0xf,(long)&uStack_838 + 4);
  if (cVar1 == '\0') {
    pcStack_840 = (code *)0x13d72d;
    test_inline_array_cold_1();
LAB_0013d72d:
    pcStack_840 = (code *)0x13d732;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_838._4_4_ != 1) goto LAB_0013d72d;
    if ((int)uStack_838 == 2) {
      pcStack_840 = (code *)0x13d719;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_840 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_840 = (code *)0x14a05b;
  pcStack_848 = "[";
  pcStack_850 = "foo";
  puStack_858 = (undefined1 *)0x0;
  uStack_860 = 0xf;
  pcStack_878 = (code *)0x13d747;
  uStack_870 = extraout_RAX_07;
  uStack_868 = uVar6;
  pcStack_8a0 = (char *)bson_bcon_magic();
  pcStack_880 = (char *)0x0;
  pcStack_888 = "}";
  pcStack_890 = (char *)0x1;
  pcStack_898 = (char *)0xf;
  uStack_8a8 = "a";
  uStack_8b0 = 2;
  uStack_8b8 = 0x13d79a;
  uVar6 = bcon_new(0,"foo","{","b",pcStack_8a0,0xf);
  pcStack_878 = (code *)0x13d7a6;
  pcStack_8a0 = (char *)bson_bcone_magic();
  uStack_8b0 = (long)&uStack_870 + 4;
  pcStack_880 = (char *)0x0;
  pcStack_888 = "}";
  pcStack_898 = (char *)0xf;
  uStack_8a8 = "b";
  uStack_8b8 = 0x13d7e9;
  pcStack_890 = (char *)&uStack_870;
  cVar1 = bcon_extract(uVar6,"foo","{","a",pcStack_8a0,0xf);
  if (cVar1 == '\0') {
    pcStack_878 = (code *)0x13d81a;
    test_inline_doc_cold_1();
LAB_0013d81a:
    pcStack_878 = (code *)0x13d81f;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_870._4_4_ != 1) goto LAB_0013d81a;
    if ((int)uStack_870 == 2) {
      pcStack_878 = (code *)0x13d806;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_878 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_878 = (code *)0x0;
  pcStack_880 = "a";
  pcStack_890 = "{";
  pcStack_898 = "foo";
  pcStack_8a0 = "}";
  pcStack_8c0 = (code *)0x13d837;
  pcStack_888 = (char *)uVar6;
  uStack_8f8 = (undefined8 *)bson_bcon_magic();
  pcStack_8c0 = (code *)0x0;
  pcStack_8c8 = (char *)0x3;
  pbStack_8d0 = (bson_t *)0xf;
  pcStack_8e0 = "c";
  pcStack_8e8 = (char *)0x2;
  pcStack_8f0 = (char *)0xf;
  uStack_900 = 0x13d879;
  uStack_8d8 = uStack_8f8;
  bson = (bson_t *)bcon_new(0,"a",uStack_8f8,0xf,1,"b");
  pcStack_8c0 = (code *)0x13d885;
  pcStack_908 = (code *)bson_bcone_magic();
  pbStack_8d0 = (bson_t *)((long)&uStack_8b0 + 4);
  uStack_8f8 = &uStack_8a8;
  pcStack_8c8 = (char *)0x0;
  uStack_8d8 = 0xf;
  pcStack_8e8 = "c";
  pcStack_8f0 = (char *)0x0;
  uStack_900 = 0xf;
  pcStack_910 = "b";
  pcStack_918 = (char *)0x0;
  pcStack_920 = (char *)0x13d8d1;
  pcStack_8e0 = (char *)pcStack_908;
  test_extract_ctx_helper(bson,3,"a",pcStack_908,0xf,(long)&uStack_8a8 + 4);
  if (uStack_8a8._4_4_ == 1) {
    if ((int)uStack_8a8 != 2) goto LAB_0013d906;
    if (uStack_8b0._4_4_ == 3) {
      pcStack_8c0 = (code *)0x13d8f2;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_8c0 = (code *)0x13d906;
    test_extract_ctx_cold_1();
LAB_0013d906:
    pcStack_8c0 = (code *)0x13d90b;
    test_extract_ctx_cold_2();
  }
  pcStack_8c0 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_8c0 = (code *)0xf;
  pcStack_8c8 = "a";
  uStack_8d8 = 0;
  pcStack_8e8 = "c";
  pcStack_908 = (code *)0x13d923;
  pcStack_8e0 = (char *)((long)&uStack_8a8 + 4);
  pbStack_8d0 = bson;
  uStack_930 = bson_bcon_magic();
  pcStack_910 = (char *)0x0;
  pcStack_918 = "}";
  pcStack_920 = (char *)0xa;
  pcStack_928 = (char *)0xf;
  pcStack_938 = (char *)0x13d978;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_908 = (code *)0x13d984;
  uStack_930 = bson_bcone_magic();
  pcStack_920 = (char *)((long)&uStack_8f8 + 4);
  pcStack_910 = (char *)0x0;
  pcStack_918 = "}";
  pcStack_928 = (char *)0xf;
  pcStack_938 = "bar";
  pcStack_940 = (code *)0x141970;
  uStack_948 = 0x13d9c0;
  cVar1 = bcon_extract(uVar6,"hello",uStack_930,0,&pcStack_8f0,"foo");
  if (cVar1 == '\0') {
    pcStack_908 = (code *)0x13da00;
    test_nested_cold_1();
LAB_0013da00:
    pcStack_908 = (code *)0x13da05;
    test_nested_cold_2();
  }
  else {
    pcStack_908 = (code *)0x13d9d9;
    iVar2 = strcmp("world",pcStack_8f0);
    if (iVar2 != 0) goto LAB_0013da00;
    if (uStack_8f8._4_4_ == 10) {
      pcStack_908 = (code *)0x13d9ec;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_908 = test_skip;
  test_nested_cold_3();
  pcStack_908 = (code *)0x14ad57;
  pcStack_910 = "bar";
  pcStack_918 = (char *)0x0;
  pcStack_920 = "hello";
  pcStack_928 = "foo";
  pcStack_940 = (code *)0x13da1a;
  uStack_930 = uVar6;
  pcStack_968 = (char *)bson_bcon_magic();
  uStack_948 = 0;
  pcStack_950 = "}";
  pcStack_958 = (char *)0xa;
  pcStack_960 = (char *)0xf;
  pcStack_970 = (char *)0x13da6d;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_940 = (code *)0x13da79;
  pcVar25 = (char *)bson_bcone_magic();
  pcVar24 = "}";
  uStack_948 = 0;
  pcStack_950 = "}";
  pcStack_958 = (char *)0x10;
  pcStack_960 = (char *)0x1c;
  pcStack_970 = "bar";
  pcStack_978 = "{";
  uStack_980 = 0x13dab5;
  pcStack_968 = pcVar25;
  cVar1 = bcon_extract(uVar6,"hello",pcVar25,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_940 = (code *)0x13db17;
    test_skip_cold_1();
  }
  else {
    uStack_948 = 0;
    pcStack_950 = "}";
    pcStack_958 = (char *)0x12;
    pcStack_960 = (char *)0x1c;
    pcStack_970 = "bar";
    pcStack_978 = "{";
    uStack_980 = 0x13daf4;
    pcStack_968 = pcVar25;
    cVar1 = bcon_extract(uVar6,"hello",pcVar25,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_940 = test_iter;
  test_skip_cold_2();
  pcStack_940 = (code *)0x14e902;
  pcStack_950 = "bar";
  pcStack_958 = "}";
  pcStack_968 = "{";
  apcStack_b08[0] = (code *)0x13db39;
  pcStack_960 = pcVar25;
  uStack_948 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_b08[0] = (code *)0x13db60;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_b08[0] = (code *)0x13db68;
  uVar6 = bson_bcone_magic();
  pcVar13 = acStack_a80;
  pcVar21 = "foo";
  pcVar19 = (char *)0x1d;
  uVar7 = 0;
  apcStack_b08[0] = (code *)0x13db88;
  pcVar22 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  if (cVar1 == '\0') {
    apcStack_b08[0] = (code *)0x13dd34;
    uVar6 = extraout_XMM1_Qa;
    test_iter_cold_1();
LAB_0013dd34:
    apcStack_b08[0] = (code *)0x13dd39;
    test_iter_cold_2();
  }
  else {
    pcVar22 = acStack_a80;
    apcStack_b08[0] = (code *)0x13db9d;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013dd34;
    pcVar22 = acStack_a80;
    apcStack_b08[0] = (code *)0x13dbb3;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 == 10) {
      uVar7 = 0;
      apcStack_b08[0] = (code *)0x13dbdf;
      __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_a80);
      apcStack_b08[0] = (code *)0x13dbea;
      pcVar25 = (char *)bson_get_data(__n_00);
      apcStack_b08[0] = (code *)0x13dbf5;
      __buf = (char *)bson_get_data(__n);
      if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
        apcStack_b08[0] = (code *)0x13dc09;
        pvVar8 = (void *)bson_get_data(__n);
        apcStack_b08[0] = (code *)0x13dc14;
        pvVar11 = (void *)bson_get_data(__n_00);
        apcStack_b08[0] = (code *)0x13dc22;
        iVar2 = bcmp(pvVar8,pvVar11,(ulong)*(uint *)(__n + 4));
        if (iVar2 == 0) {
          apcStack_b08[0] = (code *)0x13dc2e;
          bson_destroy(__n);
          apcStack_b08[0] = (code *)0x13dc36;
          bson_destroy(__n_00);
          return;
        }
      }
      apcStack_b08[0] = (code *)0x13dc4f;
      pcVar24 = (char *)bson_as_canonical_extended_json(__n_00);
      apcStack_b08[0] = (code *)0x13dc5c;
      pcVar13 = (char *)bson_as_canonical_extended_json(__n);
      uVar3 = *(uint *)(__n_00 + 4);
      uVar4 = *(uint *)(__n + 4);
      uVar6 = extraout_XMM1_Qa_02;
      if (uVar3 != 0) {
        uVar9 = 0;
        do {
          if (uVar4 == (uint)uVar9) break;
          if (pcVar25[uVar9] != __buf[uVar9]) goto LAB_0013dd28;
          uVar9 = uVar9 + 1;
        } while (uVar3 != (uint)uVar9);
      }
      if (uVar3 < uVar4) {
        uVar3 = uVar4;
      }
      uVar9 = (ulong)(uVar3 - 1);
      pcVar19 = pcVar24;
      while( true ) {
        apcStack_b08[0] = (code *)0x13dca8;
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9);
        apcStack_b08[0] = (code *)0x13dcc0;
        uVar3 = open("failure.bad.bson",0x42,0x1a0);
        pcVar24 = (char *)(ulong)uVar3;
        pcVar22 = "failure.expected.bson";
        pcVar21 = (char *)0x42;
        apcStack_b08[0] = (code *)0x13dcdb;
        uVar4 = open("failure.expected.bson",0x42,0x1a0);
        uStack_a84 = uVar3;
        if (uVar3 == 0xffffffff) break;
        if (uVar4 == 0xffffffff) goto LAB_0013dd43;
        pcVar24 = (char *)(ulong)uVar4;
        __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
        pcVar22 = (char *)(ulong)uVar3;
        apcStack_b08[0] = (code *)0x13dd01;
        pcVar21 = pcVar25;
        pcVar14 = (char *)write(uVar3,pcVar25,(size_t)__n_00);
        if (pcVar14 != __n_00) goto LAB_0013dd48;
        __n = (char *)(ulong)*(uint *)(__n + 4);
        apcStack_b08[0] = (code *)0x13dd17;
        pcVar21 = __buf;
        pcVar22 = pcVar24;
        pcVar14 = (char *)write(uVar4,__buf,(size_t)__n);
        if (pcVar14 != __n) goto LAB_0013dd4d;
        uVar9 = (ulong)uVar4;
        apcStack_b08[0] = (code *)0x13dd28;
        test_iter_cold_6();
        pcVar13 = extraout_RAX_08;
LAB_0013dd28:
        uVar9 = uVar9 & 0xffffffff;
        pcVar19 = pcVar24;
      }
      goto LAB_0013dd3e;
    }
  }
  apcStack_b08[0] = (code *)0x13dd3e;
  test_iter_cold_3();
LAB_0013dd3e:
  apcStack_b08[0] = (code *)0x13dd43;
  test_iter_cold_8();
LAB_0013dd43:
  apcStack_b08[0] = (code *)0x13dd48;
  test_iter_cold_7();
LAB_0013dd48:
  apcStack_b08[0] = (code *)0x13dd4d;
  test_iter_cold_4();
LAB_0013dd4d:
  apcStack_b08[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_7140 = auStack_7130;
  if (extraout_AL != '\0') {
    uStack_70f0 = uVar6;
  }
  pcStack_7188 = (code *)0x13ddd5;
  pcStack_7128 = pcVar21;
  pcStack_7118 = pcVar19;
  pcStack_7110 = pcVar13;
  uStack_7108 = uVar7;
  pcStack_b28 = __n;
  pcStack_b20 = pcVar25;
  pcStack_b18 = __buf;
  pcStack_b10 = __n_00;
  apcStack_b08[0] = (code *)&pcStack_940;
  bcon_extract_ctx_init(aDStack_7080);
  puStack_7148 = auStack_af8;
  uStack_7150 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_7128) {
    uVar3 = (uint)pcStack_7128;
    do {
      pcStack_7188 = (code *)0x13de41;
      __s = aDStack_7080;
      pcVar25 = pcVar22;
      cVar1 = bcon_extract_ctx_va(pcVar22,aDStack_7080,&uStack_7150);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        pcStack_7188 = assemble_path;
        test_extract_ctx_helper_cold_1();
        pcStack_71b0 = (code *)0x13de73;
        __name = __s;
        pcStack_71a8 = pcVar22;
        uStack_71a0 = (ulong)uVar3;
        pcStack_7198 = pcVar24;
        pDStack_7190 = aDStack_7080;
        pcStack_7188 = (code *)&uStack_7150;
        pdVar15 = (dirent *)strlen(pcVar25);
        pcStack_71b0 = (code *)0x13de7e;
        paths = __s;
        sVar16 = strlen((char *)__s);
        if ((int)sVar16 + (int)pdVar15 < 499) {
          pcStack_71b0 = (code *)0x13de9a;
          memset(__dest,0,500);
          pcStack_71b0 = (code *)0x13dea8;
          strncat(__dest,pcVar25,(long)(int)pdVar15);
          pcStack_71b0 = (code *)0x13deb0;
          sVar17 = strlen(__dest);
          (__dest + sVar17)[0] = '/';
          (__dest + sVar17)[1] = '\0';
          pcStack_71b0 = (code *)0x13dec4;
          strncat(__dest,(char *)__s,(long)(int)sVar16);
          pcVar25 = __dest;
          do {
            if (*pcVar25 == '\\') {
              *pcVar25 = '/';
            }
            else if (*pcVar25 == '\0') {
              return;
            }
            pcVar25 = pcVar25 + 1;
          } while( true );
        }
        pcStack_71b0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar9 = (ulong)extraout_EDX;
        pDStack_7468 = (DIR *)0x13df0c;
        __filename = __name;
        sStack_71d0 = sVar16;
        pdStack_71c8 = pdVar15;
        pDStack_71c0 = __s;
        pcStack_71b8 = pcVar25;
        pcStack_71b0 = (code *)apcStack_b08;
        __dirp = opendir((char *)__name);
        pDStack_7470 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013e018;
        pDStack_7468 = (DIR *)0x13df20;
        __filename = __dirp;
        pdVar15 = readdir(__dirp);
        do {
          if (pdVar15 == (dirent *)0x0) {
LAB_0013dff7:
            pDStack_7468 = (DIR *)0x13dfff;
            closedir(__dirp);
            return;
          }
          paths_index = (int)uVar9;
          if (iVar2 <= paths_index) {
            pDStack_7468 = (DIR *)0x13e018;
            collect_tests_from_dir_cold_1();
            pDStack_7470 = __dirp;
LAB_0013e018:
            pDStack_7468 = (DIR *)get_bson_from_json_file;
            collect_tests_from_dir_cold_2();
            uStack_7488 = uVar9;
            pDStack_7480 = paths;
            pdStack_7478 = pdVar15;
            pDStack_7468 = __name;
            __stream = fopen((char *)__filename,"rb");
            if (__stream != (FILE *)0x0) {
              fseek(__stream,0,2);
              sVar16 = ftell(__stream);
              fseek(__stream,0,0);
              if (0 < (long)sVar16) {
                pvVar8 = (void *)bson_malloc0(sVar16);
                sVar17 = fread(pvVar8,1,sVar16,__stream);
                if (sVar17 != sVar16) {
                  abort();
                }
                fclose(__stream);
                if (pvVar8 != (void *)0x0) {
                  lVar18 = bson_new_from_json(pvVar8,sVar16,auStack_7688);
                  if (lVar18 == 0) {
                    fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7680);
                    abort();
                  }
                  bson_free(pvVar8);
                }
              }
            }
            return;
          }
          while ((pdVar15->d_name[0] == '.' &&
                 (((pdVar15->d_name[1] == '.' && (pdVar15->d_name[2] == '\0')) ||
                  (pdVar15->d_name[1] == '\0'))))) {
            pDStack_7468 = (DIR *)0x13df58;
            pdVar15 = readdir(__dirp);
            if (pdVar15 == (dirent *)0x0) goto LAB_0013dff7;
          }
          pcVar25 = pdVar15->d_name;
          pDStack_7468 = (DIR *)0x13df7c;
          assemble_path((char *)__name,pcVar25,acStack_73d0);
          pDStack_7468 = (DIR *)0x13df87;
          iVar5 = stat(pcVar25,&sStack_7460);
          if ((iVar5 == 0) && ((sStack_7460.st_mode & 0xf000) == 0x4000)) {
            pDStack_7468 = (DIR *)0x13dfb1;
            uVar3 = collect_tests_from_dir((char (*) [500])paths,acStack_73d0,paths_index,iVar2);
            uVar9 = (ulong)uVar3;
          }
          else {
            pDStack_7468 = (DIR *)0x13dfc4;
            pcVar24 = strstr(pcVar25,".json");
            if (pcVar24 != (char *)0x0) {
              uVar9 = (ulong)(paths_index + 1);
              pDStack_7468 = (DIR *)0x13dfe3;
              assemble_path((char *)__name,pcVar25,(char *)(paths + (long)paths_index * 500));
            }
          }
          pDStack_7468 = (DIR *)0x13dfeb;
          __filename = __dirp;
          pdVar15 = readdir(__dirp);
        } while( true );
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void
test_binary (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_binary (
      &expected, "foo", -1, BSON_SUBTYPE_BINARY, (uint8_t *) "deadbeef", 8);

   BCON_APPEND (&bcon,
                "foo",
                BCON_BIN (BSON_SUBTYPE_BINARY, (const uint8_t *) "deadbeef", 8),
                NULL);

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}